

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
               *this,GetterYs<double> *getter1,GetterYRef *getter2,TransformerLinLin *transformer,
              ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImVec2 IVar3;
  ImPlotContext *pIVar4;
  int iVar5;
  ImPlotContext *gp;
  ImVec2 IVar6;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar5 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar5 = iVar2;
  }
  this->Prims = iVar5 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar4 = GImPlot;
  (this->P12).y = 0.0;
  iVar5 = transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar5].Min;
  IVar6.x = (float)(GImPlot->Mx *
                    ((getter1->XScale * 0.0 + getter1->X0) - (GImPlot->CurrentPlot->XAxis).Range.Min
                    ) + (double)IVar1.x);
  IVar6.y = (float)(GImPlot->My[iVar5] *
                    (*(double *)
                      ((long)getter1->Ys +
                      (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride) -
                    GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) + (double)IVar1.y);
  this->P11 = IVar6;
  iVar2 = transformer->YAxis;
  IVar1 = pIVar4->PixelRange[iVar2].Min;
  IVar3.y = (float)(pIVar4->My[iVar2] *
                    (getter2->YRef - pIVar4->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y)
  ;
  IVar3.x = (float)(pIVar4->Mx *
                    ((getter2->XScale * 0.0 + getter2->X0) - (pIVar4->CurrentPlot->XAxis).Range.Min)
                   + (double)IVar1.x);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }